

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

MetadataResult __thiscall
duckdb_shell::ShellState::DisplayEntries(ShellState *this,char **azArg,idx_t nArg,char type)

{
  ShellState *pSVar1;
  int iVar2;
  int iVar3;
  void *pVoid;
  char *pcVar4;
  size_t sVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  MetadataResult MVar12;
  sqlite3_stmt *pStmt;
  string s;
  sqlite3_stmt *local_90;
  ShellState *local_88;
  int local_7c;
  uint local_78;
  uint local_74;
  long local_70;
  long local_68;
  char *local_60;
  undefined8 local_58;
  char local_50 [16];
  ulong local_40;
  ulong local_38;
  
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = '\0';
  OpenDB(this,0);
  MVar12 = PRINT_USAGE;
  if (nArg < 3) {
    std::__cxx11::string::append((char *)&local_60);
    std::__cxx11::string::append((char *)&local_60);
    std::__cxx11::string::append((char *)&local_60);
    std::__cxx11::string::append((char *)&local_60);
    local_88 = this;
    iVar2 = duckdb_shell_sqlite3_prepare_v2(this->db,local_60,-1,&local_90,(char **)0x0);
    MVar12 = FAIL;
    if (iVar2 == 0) {
      if (nArg == 2) {
        duckdb_shell_sqlite3_bind_text
                  (local_90,1,azArg[1],-1,(_func_void_void_ptr *)0xffffffffffffffff);
      }
      else {
        duckdb_shell_sqlite3_bind_text(local_90,1,"%",-1,(_func_void_void_ptr *)0x0);
      }
      iVar8 = 1;
      lVar7 = 0;
      iVar2 = 0;
      pVoid = (void *)0x0;
      while (iVar3 = duckdb_shell_sqlite3_step(local_90), iVar3 == 100) {
        if (iVar2 <= lVar7) {
          pVoid = duckdb_shell_sqlite3_realloc64(pVoid,(long)(iVar2 * 2) * 8 + 0x50);
          if (pVoid == (void *)0x0) goto LAB_00218b84;
          iVar2 = iVar2 * 2 + 10;
        }
        duckdb_shell_sqlite3_column_text(local_90,0);
        pcVar4 = duckdb_shell_sqlite3_mprintf("%s");
        *(char **)((long)pVoid + lVar7 * 8) = pcVar4;
        if (pcVar4 == (char *)0x0) {
          DisplayEntries();
LAB_00218b84:
          DisplayEntries();
          if (local_60 != local_50) {
            operator_delete(local_60);
          }
          _Unwind_Resume(extraout_RAX);
        }
        lVar7 = lVar7 + 1;
        iVar8 = iVar8 + -1;
      }
      local_7c = duckdb_shell_sqlite3_finalize(local_90);
      if (local_7c != 0) {
        pcVar4 = duckdb_shell_sqlite3_errmsg(local_88->db);
        PrintDatabaseError(local_88,pcVar4);
      }
      if (lVar7 != 0 && local_7c == 0) {
        lVar11 = 0;
        uVar6 = 0;
        do {
          sVar5 = strlen(*(char **)((long)pVoid + lVar11 * 8));
          pSVar1 = local_88;
          uVar9 = sVar5 & 0xffffffff;
          if ((int)sVar5 < (int)uVar6) {
            uVar9 = uVar6;
          }
          lVar11 = lVar11 + 1;
          uVar6 = uVar9;
        } while (lVar7 != lVar11);
        uVar6 = 1;
        if ((uint)uVar9 < 0x4f) {
          uVar6 = 0x50 / (ulong)((uint)uVar9 + 2);
        }
        local_74 = (uint)uVar6;
        local_78 = local_74 - iVar8;
        iVar2 = (int)(local_78 / uVar6);
        local_40 = uVar9;
        if (0 < iVar2) {
          lVar11 = 0;
          local_68 = lVar7;
          do {
            local_70 = lVar11;
            if ((uint)lVar11 < (uint)local_68) {
              local_38 = (ulong)local_78 / (ulong)local_74;
              do {
                pcVar4 = "  ";
                if ((int)lVar11 < iVar2) {
                  pcVar4 = anon_var_dwarf_643533f + 9;
                }
                pcVar10 = *(char **)((long)pVoid + lVar11 * 8);
                if (pcVar10 == (char *)0x0) {
                  pcVar10 = anon_var_dwarf_643533f + 9;
                }
                fprintf((FILE *)pSVar1->out,"%s%-*s",pcVar4,uVar9,pcVar10);
                lVar11 = lVar11 + local_38;
              } while ((int)lVar11 < (int)local_68);
            }
            fputc(10,(FILE *)pSVar1->out);
            lVar11 = local_70 + 1;
            lVar7 = local_68;
          } while ((int)lVar11 < iVar2);
        }
      }
      if (lVar7 != 0) {
        lVar11 = 0;
        do {
          duckdb_shell_sqlite3_free(*(void **)((long)pVoid + lVar11 * 8));
          lVar11 = lVar11 + 1;
        } while (lVar7 != lVar11);
      }
      duckdb_shell_sqlite3_free(pVoid);
      MVar12 = local_7c != 0;
    }
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return MVar12;
}

Assistant:

MetadataResult ShellState::DisplayEntries(const char **azArg, idx_t nArg, char type) {
	sqlite3_stmt *pStmt;
	char **azResult;
	int nRow, nAlloc;
	int ii;
	string s;
	OpenDB(0);
	//    rc = sqlite3_prepare_v2(db, "PRAGMA database_list", -1, &pStmt, 0);
	//    if( rc ){
	//      sqlite3_finalize(pStmt);
	//      return shellDatabaseError(db);
	//    }

	if (nArg > 2) {
		return MetadataResult::PRINT_USAGE;
	}
	//    for(ii=0; sqlite3_step(pStmt)==SQLITE_ROW; ii++){
	//      const char *zDbName = (const char*)sqlite3_column_text(pStmt, 1);
	//      if( zDbName==0 ) continue;
	//      if( s.z && s.z[0] ) appendText(&s, " UNION ALL ", 0);
	appendText(s, "SELECT name FROM ", 0);
	//      appendText(&s, zDbName, '"');
	appendText(s, "sqlite_schema ", 0);
	if (type == 't') {
		appendText(s,
		           " WHERE type IN ('table','view')"
		           "   AND name NOT LIKE 'sqlite_%'"
		           "   AND name LIKE ?1",
		           0);
	} else {
		appendText(s,
		           " WHERE type='index'"
		           "   AND tbl_name LIKE ?1",
		           0);
	}
	//    }
	//    rc = sqlite3_finalize(pStmt);
	appendText(s, " ORDER BY 1", 0);
	int rc = sqlite3_prepare_v2(db, s.c_str(), -1, &pStmt, 0);
	if (rc) {
		return MetadataResult::FAIL;
	}

	/* Run the SQL statement prepared by the above block. Store the results
	** as an array of nul-terminated strings in azResult[].  */
	nRow = nAlloc = 0;
	azResult = nullptr;
	if (nArg > 1) {
		sqlite3_bind_text(pStmt, 1, azArg[1], -1, SQLITE_TRANSIENT);
	} else {
		sqlite3_bind_text(pStmt, 1, "%", -1, SQLITE_STATIC);
	}
	while (sqlite3_step(pStmt) == SQLITE_ROW) {
		if (nRow >= nAlloc) {
			char **azNew;
			int n2 = nAlloc * 2 + 10;
			azNew = (char **)sqlite3_realloc64(azResult, sizeof(azResult[0]) * n2);
			if (azNew == 0)
				shell_out_of_memory();
			nAlloc = n2;
			azResult = azNew;
		}
		azResult[nRow] = sqlite3_mprintf("%s", sqlite3_column_text(pStmt, 0));
		if (0 == azResult[nRow])
			shell_out_of_memory();
		nRow++;
	}
	if (sqlite3_finalize(pStmt) != SQLITE_OK) {
		rc = ShellDatabaseError(db);
	}

	/* Pretty-print the contents of array azResult[] to the output */
	if (rc == 0 && nRow > 0) {
		int len, maxlen = 0;
		int i, j;
		int nPrintCol, nPrintRow;
		for (i = 0; i < nRow; i++) {
			len = StringLength(azResult[i]);
			if (len > maxlen)
				maxlen = len;
		}
		nPrintCol = 80 / (maxlen + 2);
		if (nPrintCol < 1)
			nPrintCol = 1;
		nPrintRow = (nRow + nPrintCol - 1) / nPrintCol;
		for (i = 0; i < nPrintRow; i++) {
			for (j = i; j < nRow; j += nPrintRow) {
				const char *zSp = j < nPrintRow ? "" : "  ";
				utf8_printf(out, "%s%-*s", zSp, maxlen, azResult[j] ? azResult[j] : "");
			}
			raw_printf(out, "\n");
		}
	}

	for (ii = 0; ii < nRow; ii++) {
		sqlite3_free(azResult[ii]);
	}
	sqlite3_free(azResult);
	return rc == 0 ? MetadataResult::SUCCESS : MetadataResult::FAIL;
}